

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocketProtocol.h
# Opt level: O3

void SL::WS_LITE::
     ProcessControlMessage<true,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::basic_stream_socket<asio::ip::tcp>>>>
               (shared_ptr<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>_>
                *socket,shared_ptr<unsigned_char> *buffer,size_t size,
               shared_ptr<asio::basic_streambuf<std::allocator<char>_>_> *extradata)

{
  element_type *peVar1;
  element_type *peVar2;
  byte bVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this;
  size_type __dnew;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_60;
  size_t local_58;
  undefined1 local_50 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  
  peVar1 = (socket->
           super___shared_ptr<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if (-1 < (char)peVar1->ReceiveHeader[0]) {
    local_50._0_8_ = local_50 + 0x10;
    local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2e;
    local_50._0_8_ = std::__cxx11::string::_M_create((ulong *)local_50,(ulong)&local_60);
    local_50._16_8_ = local_60;
    builtin_strncpy((char *)local_50._0_8_,"Closing connection. Control Frames must be Fin",0x2e);
    local_50._8_8_ = local_60;
    *(char *)(local_50._0_8_ + (long)local_60) = '\0';
    sendclosemessage<true,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::basic_stream_socket<asio::ip::tcp>>>>
              (socket,0x3ea,(string *)local_50);
LAB_00129764:
    if ((undefined1 *)local_50._0_8_ == local_50 + 0x10) {
      return;
    }
    operator_delete((void *)local_50._0_8_,(ulong)(local_50._16_8_ + 1));
    return;
  }
  bVar3 = peVar1->ReceiveHeader[0] & 0xf;
  if (bVar3 == 8) {
    ProcessClose<true,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::basic_stream_socket<asio::ip::tcp>>>>
              (socket,buffer,size);
    return;
  }
  if (bVar3 == 10) {
    peVar2 = (peVar1->Parent).
             super___shared_ptr<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2->onPong).super__Function_base._M_manager == (_Manager_type)0x0) goto LAB_001299a4;
    local_50._8_8_ =
         (socket->
         super___shared_ptr<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
         )._M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_00129827:
      local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (buffer->super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    }
    else {
      if (__libc_single_threaded != '\0') {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_)->_M_use_count + 1;
        goto LAB_00129827;
      }
      LOCK();
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_)->_M_use_count =
           ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_)->_M_use_count + 1;
      UNLOCK();
      local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (buffer->super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if ((peVar2->onPong).super__Function_base._M_manager == (_Manager_type)0x0) {
        local_58 = size;
        local_50._0_8_ = peVar1;
        std::__throw_bad_function_call();
      }
    }
    local_58 = size;
    local_50._0_8_ = peVar1;
    (*(peVar2->onPong)._M_invoker)
              ((_Any_data *)&peVar2->onPong,(shared_ptr<SL::WS_LITE::IWebSocket> *)local_50,
               (uchar **)&local_60,&local_58);
    this._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_;
  }
  else {
    if (bVar3 != 9) {
      local_50._0_8_ = local_50 + 0x10;
      local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x24;
      local_50._0_8_ = std::__cxx11::string::_M_create((ulong *)local_50,(ulong)&local_60);
      local_50._16_8_ = local_60;
      builtin_strncpy((char *)local_50._0_8_,"Closing connection. nonvalid op code",0x24);
      local_50._8_8_ = local_60;
      *(char *)(local_50._0_8_ + (long)local_60) = '\0';
      sendclosemessage<true,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::basic_stream_socket<asio::ip::tcp>>>>
                (socket,0x3ea,(string *)local_50);
      goto LAB_00129764;
    }
    peVar2 = (peVar1->Parent).
             super___shared_ptr<SL::WS_LITE::WebSocketContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar2->onPing).super__Function_base._M_manager != (_Manager_type)0x0) {
      local_50._8_8_ =
           (socket->
           super___shared_ptr<SL::WS_LITE::WebSocket<true,_asio::basic_stream_socket<asio::ip::tcp>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ ==
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
LAB_001297dc:
        local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   (buffer->super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      }
      else {
        if (__libc_single_threaded != '\0') {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_)->_M_use_count + 1;
          goto LAB_001297dc;
        }
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_)->_M_use_count + 1;
        UNLOCK();
        local_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   (buffer->super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        if ((peVar2->onPing).super__Function_base._M_manager == (_Manager_type)0x0) {
          local_58 = size;
          local_50._0_8_ = peVar1;
          std::__throw_bad_function_call();
        }
      }
      local_58 = size;
      local_50._0_8_ = peVar1;
      (*(peVar2->onPing)._M_invoker)
                ((_Any_data *)&peVar2->onPing,(shared_ptr<SL::WS_LITE::IWebSocket> *)local_50,
                 (uchar **)&local_60,&local_58);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50._8_8_);
      }
    }
    local_30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_50._24_8_ = (buffer->super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_30,
               &(buffer->super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>)._M_refcount)
    ;
    local_50[0x10] = 10;
    local_50._0_8_ = local_50._24_8_;
    local_50._8_8_ = size;
    sendImpl<true,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::basic_stream_socket<asio::ip::tcp>>>,SL::WS_LITE::WSMessage>
              (socket,(WSMessage *)local_50,NO_COMPRESSION);
    this._M_pi = local_30._M_pi;
  }
  if (this._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this._M_pi);
  }
LAB_001299a4:
  ReadHeaderNext<true,std::shared_ptr<SL::WS_LITE::WebSocket<true,asio::basic_stream_socket<asio::ip::tcp>>>>
            (socket,extradata);
  return;
}

Assistant:

inline void ProcessControlMessage(const SOCKETTYPE &socket, const std::shared_ptr<unsigned char> &buffer, size_t size,
                                      const std::shared_ptr<asio::streambuf> &extradata)
    {
        if (!getFin(socket->ReceiveHeader)) {
            return sendclosemessage<isServer>(socket, 1002, "Closing connection. Control Frames must be Fin");
        }
        auto opcode = static_cast<OpCode>(getOpCode(socket->ReceiveHeader));

        switch (opcode) {
        case OpCode::PING:
            if (socket->Parent->onPing) {
                socket->Parent->onPing(socket, buffer.get(), size);
            }
            SendPong<isServer>(socket, buffer, size);
            break;
        case OpCode::PONG:
            if (socket->Parent->onPong) {
                socket->Parent->onPong(socket, buffer.get(), size);
            }
            break;
        case OpCode::CLOSE:
            return ProcessClose<isServer>(socket, buffer, size);

        default:
            return sendclosemessage<isServer>(socket, 1002, "Closing connection. nonvalid op code");
        }
        ReadHeaderNext<isServer>(socket, extradata);
    }